

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O2

void __thiscall
disruptor::test::SequenceBarrier::BasicSetterAndGetter::test_method(BasicSetterAndGetter *this)

{
  byte local_b2 [2];
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3a);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00108bc8;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_78 = "";
  local_b2[0] = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).barrier.alerted_._M_base._M_i & 1;
  local_b2[1] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_70,&local_80,0x3a,1,2,local_b2,"barrier.alerted()",local_b2 + 1,"false");
  (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).barrier.alerted_._M_base._M_i = true;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x3c);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00108bc8;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_a8 = "";
  local_b2[0] = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).barrier.alerted_._M_base._M_i & 1;
  local_b2[1] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_70,&local_b0,0x3c,1,2,local_b2,"barrier.alerted()",local_b2 + 1,"true");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(BasicSetterAndGetter) {
  BOOST_CHECK_EQUAL(barrier.alerted(), false);
  barrier.set_alerted(true);
  BOOST_CHECK_EQUAL(barrier.alerted(), true);
}